

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopObj.c
# Opt level: O1

Hop_Obj_t * Hop_ObjCreatePo(Hop_Man_t *p,Hop_Obj_t *pDriver)

{
  Vec_Ptr_t *pVVar1;
  Hop_Obj_t *pHVar2;
  void **ppvVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  
  pHVar2 = Hop_ManFetchMemory(p);
  *(uint *)&pHVar2->field_0x20 = *(uint *)&pHVar2->field_0x20 & 0xfffffff8 | 3;
  pVVar1 = p->vPos;
  uVar5 = pVVar1->nCap;
  if (pVVar1->nSize == uVar5) {
    if ((int)uVar5 < 0x10) {
      if (pVVar1->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(pVVar1->pArray,0x80);
      }
      pVVar1->pArray = ppvVar3;
      iVar6 = 0x10;
    }
    else {
      iVar6 = uVar5 * 2;
      if (iVar6 <= (int)uVar5) goto LAB_007acf63;
      if (pVVar1->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc((ulong)uVar5 << 4);
      }
      else {
        ppvVar3 = (void **)realloc(pVVar1->pArray,(ulong)uVar5 << 4);
      }
      pVVar1->pArray = ppvVar3;
    }
    pVVar1->nCap = iVar6;
  }
LAB_007acf63:
  iVar6 = pVVar1->nSize;
  pVVar1->nSize = iVar6 + 1;
  pVVar1->pArray[iVar6] = pHVar2;
  pHVar2->pFanin0 = pDriver;
  uVar4 = (ulong)pDriver & 0xfffffffffffffffe;
  uVar5 = *(uint *)(uVar4 + 0x20) & 0xffffffc0;
  if (p->fRefCount == 0) {
    *(uint *)&pHVar2->field_0x20 = *(uint *)&pHVar2->field_0x20 & 0x3f | uVar5;
  }
  else {
    *(uint *)(uVar4 + 0x20) = uVar5 + (*(uint *)(uVar4 + 0x20) & 0x3f) + 0x40;
  }
  if (((ulong)pDriver & 1) == 0) {
    uVar5 = *(uint *)&pDriver->field_0x20;
  }
  else {
    uVar5 = ~*(uint *)(uVar4 + 0x20);
  }
  *(uint *)&pHVar2->field_0x20 = *(uint *)&pHVar2->field_0x20 & 0xfffffff7 | uVar5 & 8;
  p->nObjs[3] = p->nObjs[3] + 1;
  return pHVar2;
}

Assistant:

Hop_Obj_t * Hop_ObjCreatePo( Hop_Man_t * p, Hop_Obj_t * pDriver )
{
    Hop_Obj_t * pObj;
    pObj = Hop_ManFetchMemory( p );
    pObj->Type = AIG_PO;
    Vec_PtrPush( p->vPos, pObj );
    // add connections
    pObj->pFanin0 = pDriver;
    if ( p->fRefCount )
        Hop_ObjRef( Hop_Regular(pDriver) );
    else
        pObj->nRefs = Hop_ObjLevel( Hop_Regular(pDriver) );
    // set the phase
    pObj->fPhase = Hop_ObjPhaseCompl(pDriver);
    // update node counters of the manager
    p->nObjs[AIG_PO]++;
    return pObj;
}